

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

bool bssl::parse_ech_config
               (CBS *cbs,ECHConfig *out,bool *out_supported,bool all_extensions_mandatory)

{
  bool bVar1;
  int iVar2;
  uint8_t *ptr;
  size_t sVar3;
  size_t sVar4;
  Span<const_unsigned_char> SVar5;
  undefined1 local_118 [8];
  CBS body;
  uint16_t type;
  uchar *puStack_100;
  bool has_unknown_mandatory_extension;
  size_t local_f8;
  uchar *local_f0;
  size_t local_e8;
  uchar *local_e0;
  size_t local_d8;
  bssl *local_d0;
  undefined1 local_c0 [8];
  CBS extensions;
  CBS cipher_suites;
  CBS public_key;
  CBS public_name;
  undefined1 local_70 [8];
  CBS ech_config;
  undefined1 local_50 [8];
  CBS contents;
  CBS orig;
  uint16_t version;
  bool all_extensions_mandatory_local;
  bool *out_supported_local;
  ECHConfig *out_local;
  CBS *cbs_local;
  
  contents.len = (size_t)cbs->data;
  orig.data = (uint8_t *)cbs->len;
  orig.len._7_1_ = all_extensions_mandatory;
  iVar2 = CBS_get_u16(cbs,(uint16_t *)((long)&orig.len + 4));
  if ((iVar2 == 0) || (iVar2 = CBS_get_u16_length_prefixed(cbs,(CBS *)local_50), iVar2 == 0)) {
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                  ,0x1a6);
    cbs_local._7_1_ = false;
  }
  else if (orig.len._4_2_ == -499) {
    ptr = CBS_data((CBS *)&contents.len);
    sVar3 = CBS_len((CBS *)&contents.len);
    sVar4 = CBS_len(cbs);
    Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)&ech_config.len,ptr,sVar3 - sVar4);
    bVar1 = Array<unsigned_char>::CopyFrom(&out->raw,stack0xffffffffffffffa0);
    if (bVar1) {
      Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                ((Span<unsigned_char_const> *)&public_name.len,&out->raw);
      cbs_st::cbs_st((cbs_st *)local_70,stack0xffffffffffffff80);
      iVar2 = CBS_skip((CBS *)local_70,2);
      if ((((((iVar2 == 0) ||
             (iVar2 = CBS_get_u16_length_prefixed((CBS *)local_70,(CBS *)local_50), iVar2 == 0)) ||
            (iVar2 = CBS_get_u8((CBS *)local_50,&out->config_id), iVar2 == 0)) ||
           ((iVar2 = CBS_get_u16((CBS *)local_50,&out->kem_id), iVar2 == 0 ||
            (iVar2 = CBS_get_u16_length_prefixed((CBS *)local_50,(CBS *)&cipher_suites.len),
            iVar2 == 0)))) ||
          ((sVar3 = CBS_len((CBS *)&cipher_suites.len), sVar3 == 0 ||
           ((iVar2 = CBS_get_u16_length_prefixed((CBS *)local_50,(CBS *)&extensions.len), iVar2 == 0
            || (sVar3 = CBS_len((CBS *)&extensions.len), sVar3 == 0)))))) ||
         ((sVar3 = CBS_len((CBS *)&extensions.len), (sVar3 & 3) != 0 ||
          ((((iVar2 = CBS_get_u8((CBS *)local_50,&out->maximum_name_length), iVar2 == 0 ||
             (iVar2 = CBS_get_u8_length_prefixed((CBS *)local_50,(CBS *)&public_key.len), iVar2 == 0
             )) || (sVar3 = CBS_len((CBS *)&public_key.len), sVar3 == 0)) ||
           ((iVar2 = CBS_get_u16_length_prefixed((CBS *)local_50,(CBS *)local_c0), iVar2 == 0 ||
            (sVar3 = CBS_len((CBS *)local_50), sVar3 != 0)))))))) {
        ERR_put_error(0x10,0,0x89,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                      ,0x1c5);
        cbs_local._7_1_ = false;
      }
      else {
        SVar5 = cbs_st::operator_cast_to_Span((cbs_st *)&public_key.len);
        local_d0 = (bssl *)SVar5.data_;
        SVar5.data_ = SVar5.size_;
        bVar1 = ssl_is_valid_ech_public_name(local_d0,SVar5);
        if (bVar1) {
          SVar5 = cbs_st::operator_cast_to_Span((cbs_st *)&cipher_suites.len);
          local_e0 = SVar5.data_;
          (out->public_key).data_ = local_e0;
          local_d8 = SVar5.size_;
          (out->public_key).size_ = local_d8;
          SVar5 = cbs_st::operator_cast_to_Span((cbs_st *)&public_key.len);
          local_f0 = SVar5.data_;
          (out->public_name).data_ = local_f0;
          local_e8 = SVar5.size_;
          (out->public_name).size_ = local_e8;
          SVar5 = cbs_st::operator_cast_to_Span((cbs_st *)&extensions.len);
          puStack_100 = SVar5.data_;
          (out->cipher_suites).data_ = puStack_100;
          local_f8 = SVar5.size_;
          (out->cipher_suites).size_ = local_f8;
          body.len._7_1_ = 0;
          while (sVar3 = CBS_len((CBS *)local_c0), sVar3 != 0) {
            iVar2 = CBS_get_u16((CBS *)local_c0,(uint16_t *)((long)&body.len + 4));
            if ((iVar2 == 0) ||
               (iVar2 = CBS_get_u16_length_prefixed((CBS *)local_c0,(CBS *)local_118), iVar2 == 0))
            {
              ERR_put_error(0x10,0,0x89,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                            ,0x1dd);
              return false;
            }
            if (((body.len._4_2_ & 0x8000) != 0) || ((orig.len._7_1_ & 1) != 0)) {
              body.len._7_1_ = 1;
            }
          }
          *out_supported = (bool)((body.len._7_1_ ^ 0xff) & 1);
          cbs_local._7_1_ = true;
        }
        else {
          *out_supported = false;
          cbs_local._7_1_ = true;
        }
      }
    }
    else {
      cbs_local._7_1_ = false;
    }
  }
  else {
    *out_supported = false;
    cbs_local._7_1_ = true;
  }
  return cbs_local._7_1_;
}

Assistant:

static bool parse_ech_config(CBS *cbs, ECHConfig *out, bool *out_supported,
                             bool all_extensions_mandatory) {
  uint16_t version;
  CBS orig = *cbs;
  CBS contents;
  if (!CBS_get_u16(cbs, &version) ||
      !CBS_get_u16_length_prefixed(cbs, &contents)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }

  if (version != kECHConfigVersion) {
    *out_supported = false;
    return true;
  }

  // Make a copy of the ECHConfig and parse from it, so the results alias into
  // the saved copy.
  if (!out->raw.CopyFrom(
          Span(CBS_data(&orig), CBS_len(&orig) - CBS_len(cbs)))) {
    return false;
  }

  CBS ech_config(out->raw);
  CBS public_name, public_key, cipher_suites, extensions;
  if (!CBS_skip(&ech_config, 2) ||  // version
      !CBS_get_u16_length_prefixed(&ech_config, &contents) ||
      !CBS_get_u8(&contents, &out->config_id) ||
      !CBS_get_u16(&contents, &out->kem_id) ||
      !CBS_get_u16_length_prefixed(&contents, &public_key) ||
      CBS_len(&public_key) == 0 ||
      !CBS_get_u16_length_prefixed(&contents, &cipher_suites) ||
      CBS_len(&cipher_suites) == 0 || CBS_len(&cipher_suites) % 4 != 0 ||
      !CBS_get_u8(&contents, &out->maximum_name_length) ||
      !CBS_get_u8_length_prefixed(&contents, &public_name) ||
      CBS_len(&public_name) == 0 ||
      !CBS_get_u16_length_prefixed(&contents, &extensions) ||
      CBS_len(&contents) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }

  if (!ssl_is_valid_ech_public_name(public_name)) {
    // TODO(https://crbug.com/boringssl/275): The draft says ECHConfigs with
    // invalid public names should be ignored, but LDH syntax failures are
    // unambiguously invalid.
    *out_supported = false;
    return true;
  }

  out->public_key = public_key;
  out->public_name = public_name;
  // This function does not ensure |out->kem_id| and |out->cipher_suites| use
  // supported algorithms. The caller must do this.
  out->cipher_suites = cipher_suites;

  bool has_unknown_mandatory_extension = false;
  while (CBS_len(&extensions) != 0) {
    uint16_t type;
    CBS body;
    if (!CBS_get_u16(&extensions, &type) ||
        !CBS_get_u16_length_prefixed(&extensions, &body)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      return false;
    }
    // We currently do not support any extensions.
    if (type & 0x8000 || all_extensions_mandatory) {
      // Extension numbers with the high bit set are mandatory. Continue parsing
      // to enforce syntax, but we will ultimately ignore this ECHConfig as a
      // client and reject it as a server.
      has_unknown_mandatory_extension = true;
    }
  }

  *out_supported = !has_unknown_mandatory_extension;
  return true;
}